

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::Seek(Iter *this,Slice *target)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *d;
  Iter *in_RDI;
  Slice mid_key;
  char *key_ptr;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  uint32_t region_offset;
  uint32_t mid;
  uint32_t right;
  uint32_t left;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  Iter *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  Iter *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint local_18;
  uint local_14;
  
  local_14 = 0;
  local_18 = in_RDI->num_restarts_ - 1;
  uVar2 = local_14;
  while( true ) {
    local_14 = uVar2;
    if (local_18 <= local_14) {
      SeekToRestartPoint(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      do {
        bVar1 = ParseNextKey((Iter *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        if (!bVar1) {
          return;
        }
        Slice::Slice((Slice *)in_RDI,
                     (string *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        iVar3 = Compare(in_RDI,(Slice *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ),(Slice *)0x146aeb);
      } while (iVar3 < 0);
      return;
    }
    uVar2 = local_14 + local_18 + 1 >> 1;
    GetRestartPoint(in_RDI,in_stack_ffffffffffffff9c);
    d = DecodeEntry(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                    (uint32_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (uint32_t *)in_RDI,
                    (uint32_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if ((d == (char *)0x0) || (in_stack_ffffffffffffffdc != 0)) break;
    Slice::Slice((Slice *)&stack0xffffffffffffffb8,d,(ulong)in_stack_ffffffffffffffd8);
    iVar3 = Compare(in_RDI,(Slice *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (Slice *)0x146a87);
    if (-1 < iVar3) {
      local_18 = uVar2 - 1;
      uVar2 = local_14;
    }
  }
  CorruptionError(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void Seek(const Slice& target) override {
    // Binary search in restart array to find the last restart point
    // with a key < target
    uint32_t left = 0;
    uint32_t right = num_restarts_ - 1;
    while (left < right) {
      uint32_t mid = (left + right + 1) / 2;
      uint32_t region_offset = GetRestartPoint(mid);
      uint32_t shared, non_shared, value_length;
      const char* key_ptr =
          DecodeEntry(data_ + region_offset, data_ + restarts_, &shared,
                      &non_shared, &value_length);
      if (key_ptr == nullptr || (shared != 0)) {
        CorruptionError();
        return;
      }
      Slice mid_key(key_ptr, non_shared);
      if (Compare(mid_key, target) < 0) {
        // Key at "mid" is smaller than "target".  Therefore all
        // blocks before "mid" are uninteresting.
        left = mid;
      } else {
        // Key at "mid" is >= "target".  Therefore all blocks at or
        // after "mid" are uninteresting.
        right = mid - 1;
      }
    }

    // Linear search (within restart block) for first key >= target
    SeekToRestartPoint(left);
    while (true) {
      if (!ParseNextKey()) {
        return;
      }
      if (Compare(key_, target) >= 0) {
        return;
      }
    }
  }